

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,vector<char_*,_std::allocator<char_*>_> *variable,
          string *value)

{
  long lVar1;
  char *__dest;
  char *__src;
  char *local_28;
  char *var;
  string *value_local;
  vector<char_*,_std::allocator<char_*>_> *variable_local;
  CommandLineArguments *this_local;
  
  var = (char *)value;
  value_local = (string *)variable;
  variable_local = (vector<char_*,_std::allocator<char_*>_> *)this;
  lVar1 = std::__cxx11::string::size();
  __dest = (char *)operator_new__(lVar1 + 1);
  local_28 = __dest;
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(__dest,__src);
  std::vector<char_*,_std::allocator<char_*>_>::push_back
            ((vector<char_*,_std::allocator<char_*>_> *)value_local,&local_28);
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(
  std::vector<char*>* variable, const std::string& value)
{
  char* var = new char[ value.size() + 1 ];
  strcpy(var, value.c_str());
  variable->push_back(var);
}